

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cc
# Opt level: O0

void anon_unknown.dwarf_5269::buildRoadmap
               (RVOSimulator *simulator,
               vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
               *roadmap)

{
  int iVar1;
  Vector2 *pVVar2;
  bool bVar3;
  size_type sVar4;
  reference pRVar5;
  ulong uVar6;
  reference pfVar7;
  reference p_Var8;
  pointer ppVar9;
  reference piVar10;
  reference pRVar11;
  vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
  *in_RSI;
  Vector2 *in_RDI;
  float fVar12;
  float distUV;
  int v;
  int j_1;
  int u;
  vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
  posInQ;
  multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_> Q;
  int i_1;
  int j;
  int i;
  int in_stack_fffffffffffffd38;
  float in_stack_fffffffffffffd3c;
  iterator in_stack_fffffffffffffd40;
  iterator in_stack_fffffffffffffd48;
  pair<float,_int> in_stack_fffffffffffffd50;
  reference in_stack_fffffffffffffd58;
  reference in_stack_fffffffffffffd60;
  size_type in_stack_fffffffffffffd68;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd70;
  pair<float,_int> local_110;
  pair<float_const,int> local_108 [8];
  _Rb_tree_iterator<std::pair<const_float,_int>_> local_100;
  _Base_ptr local_f8;
  pair<float,_int> local_f0;
  pair<float_const,int> local_e8 [8];
  _Base_ptr local_e0;
  _Self local_d8;
  undefined8 local_cc;
  float local_c4;
  int local_c0;
  int local_bc;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  int local_9c;
  pair<float,_int> local_98;
  pair<float_const,int> local_90 [8];
  _Base_ptr local_88;
  _Base_ptr local_70;
  vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
  local_68 [3];
  int local_1c;
  int local_18;
  int local_14;
  vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
  *local_10;
  Vector2 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_14 = 0; iVar1 = local_14,
      sVar4 = std::
              vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
              ::size(local_10), iVar1 < (int)sVar4; local_14 = local_14 + 1) {
    for (local_18 = 0; iVar1 = local_18,
        sVar4 = std::
                vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                ::size(local_10), pVVar2 = local_8, iVar1 < (int)sVar4; local_18 = local_18 + 1) {
      pRVar5 = std::
               vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
               ::operator[](local_10,(long)local_14);
      std::
      vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
      ::operator[](local_10,(long)local_18);
      fVar12 = (float)RVO::RVOSimulator::getAgentRadius((ulong)local_8);
      uVar6 = RVO::RVOSimulator::queryVisibility(pVVar2,&pRVar5->position,fVar12);
      if ((uVar6 & 1) != 0) {
        std::
        vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
        ::operator[](local_10,(long)local_14);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                   (value_type *)in_stack_fffffffffffffd48._M_node);
      }
    }
    std::
    vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
    ::operator[](local_10,(long)local_14);
    std::numeric_limits<float>::infinity();
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (value_type_conflict)((ulong)in_stack_fffffffffffffd60 >> 0x20));
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    std::multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>::
    multimap((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
              *)0x1037c2);
    std::
    vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
    ::size(local_10);
    local_70 = (_Base_ptr)
               std::
               multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
               ::end((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>::allocator
              ((allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_> *)0x103813);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
    ::vector((vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
              *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58,
             (value_type *)in_stack_fffffffffffffd50,
             (allocator_type *)in_stack_fffffffffffffd48._M_node);
    std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>::~allocator
              ((allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_> *)0x103847);
    pRVar5 = std::
             vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
             ::operator[](local_10,(long)local_1c);
    pfVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&pRVar5->distToGoal,(long)local_1c);
    *pfVar7 = 0.0;
    local_98 = std::make_pair<float,int>(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
    std::pair<float_const,int>::pair<float,int>(local_90,&local_98);
    local_88 = (_Base_ptr)
               std::
               multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
               ::insert((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                        (value_type *)0x1038ec);
    p_Var8 = std::
             vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
             ::operator[](local_68,(long)local_1c);
    p_Var8->_M_node = local_88;
    while (bVar3 = std::
                   multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                   ::empty((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                            *)0x103945), ((bVar3 ^ 0xffU) & 1) != 0) {
      local_a8 = (_Base_ptr)
                 std::
                 multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                 ::begin((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_float,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_float,_int>_> *)0x103994);
      local_9c = ppVar9->second;
      local_b0 = (_Base_ptr)
                 std::
                 multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                 ::begin((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>::
      erase((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_> *
            )CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),in_stack_fffffffffffffd40
           );
      local_b8 = (_Base_ptr)
                 std::
                 multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                 ::end((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      p_Var8 = std::
               vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
               ::operator[](local_68,(long)local_9c);
      p_Var8->_M_node = local_b8;
      local_bc = 0;
      while( true ) {
        iVar1 = local_bc;
        pRVar5 = std::
                 vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                 ::operator[](local_10,(long)local_9c);
        sVar4 = std::vector<int,_std::allocator<int>_>::size(&pRVar5->neighbors);
        if ((int)sVar4 <= iVar1) break;
        pRVar5 = std::
                 vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                 ::operator[](local_10,(long)local_9c);
        piVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pRVar5->neighbors,(long)local_bc);
        local_c0 = *piVar10;
        pRVar5 = std::
                 vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                 ::operator[](local_10,(long)local_c0);
        pRVar11 = std::
                  vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                  ::operator[](local_10,(long)local_9c);
        local_cc = RVO::Vector2::operator-(&pRVar5->position,&pRVar11->position);
        local_c4 = (float)RVO::abs((Vector2 *)&local_cc);
        pRVar5 = std::
                 vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                 ::operator[](local_10,(long)local_c0);
        pfVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pRVar5->distToGoal,(long)local_1c);
        fVar12 = *pfVar7;
        pRVar5 = std::
                 vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                 ::operator[](local_10,(long)local_9c);
        pfVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pRVar5->distToGoal,(long)local_1c);
        if (*pfVar7 + local_c4 < fVar12) {
          pRVar5 = std::
                   vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                   ::operator[](local_10,(long)local_9c);
          pfVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&pRVar5->distToGoal,(long)local_1c);
          fVar12 = *pfVar7 + local_c4;
          pRVar5 = std::
                   vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                   ::operator[](local_10,(long)local_c0);
          pfVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&pRVar5->distToGoal,(long)local_1c);
          *pfVar7 = fVar12;
          p_Var8 = std::
                   vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
                   ::operator[](local_68,(long)local_c0);
          local_d8._M_node =
               (_Base_ptr)
               std::
               multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
               ::end((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          bVar3 = std::operator==(p_Var8,&local_d8);
          if (bVar3) {
            pRVar5 = std::
                     vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                     ::operator[](local_10,(long)local_c0);
            std::vector<float,_std::allocator<float>_>::operator[]
                      (&pRVar5->distToGoal,(long)local_1c);
            local_f0 = std::make_pair<float,int>
                                 (in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
            std::pair<float_const,int>::pair<float,int>(local_e8,&local_f0);
            local_e0 = (_Base_ptr)
                       std::
                       multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                       ::insert((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                (value_type *)0x103e02);
            p_Var8 = std::
                     vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
                     ::operator[](local_68,(long)local_c0);
            p_Var8->_M_node = local_e0;
          }
          else {
            p_Var8 = std::
                     vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
                     ::operator[](local_68,(long)local_c0);
            local_f8 = p_Var8->_M_node;
            std::
            multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>::
            erase((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                  in_stack_fffffffffffffd40);
            in_stack_fffffffffffffd60 =
                 std::
                 vector<(anonymous_namespace)::RoadmapVertex,_std::allocator<(anonymous_namespace)::RoadmapVertex>_>
                 ::operator[](local_10,(long)local_c0);
            in_stack_fffffffffffffd58 =
                 std::vector<float,_std::allocator<float>_>::operator[]
                           (&in_stack_fffffffffffffd60->distToGoal,(long)local_1c);
            in_stack_fffffffffffffd50 =
                 std::make_pair<float,int>(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
            local_110 = in_stack_fffffffffffffd50;
            std::pair<float_const,int>::pair<float,int>(local_108,&local_110);
            in_stack_fffffffffffffd48 =
                 std::
                 multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                 ::insert((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                          (value_type *)0x103f7d);
            local_100._M_node = in_stack_fffffffffffffd48._M_node;
            in_stack_fffffffffffffd40._M_node =
                 (_Base_ptr)
                 std::
                 vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
                 ::operator[](local_68,(long)local_c0);
            *(_Base_ptr *)in_stack_fffffffffffffd40._M_node = local_100._M_node;
          }
        }
        local_bc = local_bc + 1;
      }
    }
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
    ::~vector((vector<std::_Rb_tree_iterator<std::pair<const_float,_int>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_float,_int>_>_>_>
               *)in_stack_fffffffffffffd60);
    std::multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>::
    ~multimap((multimap<float,_int,_std::less<float>,_std::allocator<std::pair<const_float,_int>_>_>
               *)0x103ff8);
  }
  return;
}

Assistant:

void buildRoadmap(
    RVO::RVOSimulator *simulator,
    std::vector<RoadmapVertex> &roadmap) { /* NOLINT(runtime/references) */
  /* Connect the roadmap vertices by edges if mutually visible. */
#ifdef _OPENMP
#pragma omp parallel for
#endif /* _OPENMP */
  for (int i = 0; i < static_cast<int>(roadmap.size()); ++i) {
    for (int j = 0; j < static_cast<int>(roadmap.size()); ++j) {
      if (simulator->queryVisibility(roadmap[i].position, roadmap[j].position,
                                     simulator->getAgentRadius(0U))) {
        roadmap[i].neighbors.push_back(j);
      }
    }

    /* Initialize the distance to each of the four goal vertices at infinity. */
    roadmap[i].distToGoal.resize(4U, std::numeric_limits<float>::infinity());
  }

  /* Compute the distance to each of the four goals (the first four vertices)
   * for all vertices using Dijkstra's algorithm. */
#ifdef _OPENMP
#pragma omp parallel for
#endif /* _OPENMP */
  for (int i = 0; i < 4; ++i) {
    std::multimap<float, int> Q;
    std::vector<std::multimap<float, int>::iterator> posInQ(roadmap.size(),
                                                            Q.end());

    roadmap[i].distToGoal[i] = 0.0F;
    posInQ[i] = Q.insert(std::make_pair(0.0F, i));

    while (!Q.empty()) {
      const int u = Q.begin()->second;
      Q.erase(Q.begin());
      posInQ[u] = Q.end();

      for (int j = 0; j < static_cast<int>(roadmap[u].neighbors.size()); ++j) {
        const int v = roadmap[u].neighbors[j];
        const float distUV =
            RVO::abs(roadmap[v].position - roadmap[u].position);

        if (roadmap[v].distToGoal[i] > roadmap[u].distToGoal[i] + distUV) {
          roadmap[v].distToGoal[i] = roadmap[u].distToGoal[i] + distUV;

          if (posInQ[v] == Q.end()) {
            posInQ[v] = Q.insert(std::make_pair(roadmap[v].distToGoal[i], v));
          } else {
            Q.erase(posInQ[v]);
            posInQ[v] = Q.insert(std::make_pair(roadmap[v].distToGoal[i], v));
          }
        }
      }
    }
  }
}